

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ndn-rule-storage.c
# Opt level: O0

int ndn_rule_storage_remove_rule(char *rule_name)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  int local_1c;
  int i;
  char *rule_name_local;
  
  local_1c = 0;
  do {
    if (4 < local_1c) {
      return 0;
    }
    iVar1 = strcmp(ndn_rule_storage.rule_names[local_1c].name,rule_name);
    if (iVar1 == 0) {
      sVar2 = strlen(ndn_rule_storage.rule_names[local_1c].name);
      sVar3 = strlen(rule_name);
      if (sVar2 == sVar3) {
        memset(ndn_rule_storage.rule_objects + local_1c,0,0x4c0);
        ndn_rule_storage.rule_names[local_1c].name[0] = '\0';
        return 0;
      }
    }
    local_1c = local_1c + 1;
  } while( true );
}

Assistant:

int
ndn_rule_storage_remove_rule(const char *rule_name)
{
  for (int i = 0; i < NDN_TRUST_SCHEMA_MAX_SUBPATTERN_MATCHES; i++) {
    if (strcmp((const char *)&ndn_rule_storage.rule_names[i].name, rule_name) == 0
        && strlen((const char *)&ndn_rule_storage.rule_names[i].name) == strlen(rule_name)) {
      memset(&ndn_rule_storage.rule_objects[i], 0, sizeof(ndn_trust_schema_rule_t));
      ndn_rule_storage.rule_names[i].name[0] = '\0';
      return NDN_SUCCESS;
    }
  }
  return NDN_SUCCESS;
}